

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::
write_padded<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::double_writer>
          (basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>> *this,
          align_spec *spec,double_writer *f)

{
  byte bVar1;
  undefined8 *puVar2;
  long lVar3;
  char cVar4;
  size_t __n;
  size_t __n_00;
  size_t size;
  char *pcVar5;
  char __tmp;
  ulong uVar6;
  basic_buffer<char> *c;
  ptrdiff_t _Num_2;
  size_t __n_01;
  ulong uVar7;
  char *__dest;
  
  uVar7 = (ulong)spec->width_;
  cVar4 = f->sign;
  uVar6 = (f->buffer->size_ + 1) - (ulong)(cVar4 == '\0');
  puVar2 = *(undefined8 **)this;
  lVar3 = puVar2[2];
  __n = uVar7 - uVar6;
  if (uVar7 < uVar6 || __n == 0) {
    uVar6 = uVar6 + lVar3;
    if ((ulong)puVar2[3] < uVar6) {
      (**(code **)*puVar2)(puVar2,uVar6);
      cVar4 = f->sign;
    }
    puVar2[2] = uVar6;
    __dest = (char *)(lVar3 + puVar2[1]);
    if (cVar4 != '\0') {
      *__dest = cVar4;
      __dest = __dest + 1;
      f->n = f->n - 1;
    }
    __n_00 = f->buffer->size_;
    if (__n_00 == 0) {
      return;
    }
    pcVar5 = f->buffer->ptr_;
LAB_0011d3bf:
    memmove(__dest,pcVar5,__n_00);
    return;
  }
  uVar7 = uVar7 + lVar3;
  if ((ulong)puVar2[3] < uVar7) {
    (**(code **)*puVar2)(puVar2,uVar7);
  }
  puVar2[2] = uVar7;
  pcVar5 = (char *)(lVar3 + puVar2[1]);
  bVar1 = (byte)spec->fill_;
  if (spec->align_ == ALIGN_CENTER) {
    uVar6 = __n >> 1;
    if (1 < __n) {
      memset(pcVar5,(uint)bVar1,uVar6);
      pcVar5 = pcVar5 + uVar6;
    }
    if (f->sign != '\0') {
      *pcVar5 = f->sign;
      pcVar5 = pcVar5 + 1;
      f->n = f->n - 1;
    }
    __n_01 = f->buffer->size_;
    if (__n_01 != 0) {
      memmove(pcVar5,f->buffer->ptr_,__n_01);
    }
    __n = __n - uVar6;
  }
  else {
    if (spec->align_ == ALIGN_RIGHT) {
      __dest = pcVar5 + __n;
      memset(pcVar5,(uint)bVar1,__n);
      if (f->sign != '\0') {
        *__dest = f->sign;
        __dest = __dest + 1;
        f->n = f->n - 1;
      }
      __n_00 = f->buffer->size_;
      if (__n_00 == 0) {
        return;
      }
      pcVar5 = f->buffer->ptr_;
      goto LAB_0011d3bf;
    }
    if (f->sign != '\0') {
      *pcVar5 = f->sign;
      pcVar5 = pcVar5 + 1;
      f->n = f->n - 1;
    }
    __n_01 = f->buffer->size_;
    if (__n_01 != 0) {
      memmove(pcVar5,f->buffer->ptr_,__n_01);
    }
  }
  memset(pcVar5 + __n_01,(uint)bVar1,__n);
  return;
}

Assistant:

void write_padded(const align_spec &spec, F &&f) {
    unsigned width = spec.width(); // User-perceived width (in code points).
    size_t size = f.size(); // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points)
      return f(reserve(size));
    auto &&it = reserve(width + (size - num_code_points));
    char_type fill = static_cast<char_type>(spec.fill());
    std::size_t padding = width - num_code_points;
    if (spec.align() == ALIGN_RIGHT) {
      it = std::fill_n(it, padding, fill);
      f(it);
    } else if (spec.align() == ALIGN_CENTER) {
      std::size_t left_padding = padding / 2;
      it = std::fill_n(it, left_padding, fill);
      f(it);
      it = std::fill_n(it, padding - left_padding, fill);
    } else {
      f(it);
      it = std::fill_n(it, padding, fill);
    }
  }